

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getenv.c
# Opt level: O0

char * getenv(char *__name)

{
  int iVar1;
  size_t __n;
  long local_28;
  size_t index;
  size_t len;
  char *name_local;
  
  __n = strlen(__name);
  local_28 = 0;
  while( true ) {
    if (*(long *)(_environ + local_28 * 8) == 0) {
      return (char *)0x0;
    }
    iVar1 = strncmp(*(char **)(_environ + local_28 * 8),__name,__n);
    if (iVar1 == 0) break;
    local_28 = local_28 + 1;
  }
  return (char *)(*(long *)(_environ + local_28 * 8) + __n + 1);
}

Assistant:

char * getenv( const char * name )
{
    size_t len = strlen( name );
    size_t index = 0;

    while ( environ[ index ] != NULL )
    {
        if ( strncmp( environ[ index ], name, len ) == 0 )
        {
            return environ[ index ] + len + 1;
        }

        index++;
    }

    return NULL;
}